

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  
  bVar1 = internal::
          format_uint<1u,char,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_int>
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)
                     it->container,*(uint *)this,*(int *)(this + 4),false);
  it->container = (list<char,_std::allocator<char>_> *)bVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }